

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall SAT::clearSeen(SAT *this)

{
  int *piVar1;
  bool *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(this->ivseen_toclear).sz;
  piVar1 = (this->ivseen_toclear).data;
  if (uVar3 == 0) {
    if (piVar1 == (int *)0x0) goto LAB_001c31ab;
  }
  else {
    pbVar2 = (this->ivseen).data;
    uVar4 = 0;
    do {
      pbVar2[(uint)piVar1[uVar4]] = false;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  (this->ivseen_toclear).sz = 0;
LAB_001c31ab:
  if ((this->out_learnt).sz != 0) {
    uVar3 = 0;
    do {
      (this->seen).data[(uint)((this->out_learnt).data[uVar3].x >> 1)] = '\0';
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->out_learnt).sz);
  }
  return;
}

Assistant:

void SAT::clearSeen() {
	for (unsigned int i = 0; i < ivseen_toclear.size(); i++) {
		ivseen[ivseen_toclear[i]] = false;
	}
	ivseen_toclear.clear();

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		seen[var(out_learnt[i])] = 0;  // ('seen[]' is now cleared)
	}
}